

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::FindConfig(cmFindPackageCommand *this)

{
  cmMakefile *this_00;
  undefined1 uVar1;
  char *value;
  char *doc;
  allocator<char> local_a9;
  string local_a8 [8];
  string help;
  string local_58;
  string local_38 [8];
  string init;
  bool found;
  cmFindPackageCommand *this_local;
  
  ComputePrefixes(this);
  init.field_2._M_local_buf[0xf] = '\0';
  if ((((this->super_cmFindCommon).SearchFrameworkFirst & 1U) != 0) ||
     (((this->super_cmFindCommon).SearchFrameworkOnly & 1U) != 0)) {
    init.field_2._M_local_buf[0xf] = FindFrameworkConfig(this);
  }
  if ((init.field_2._M_local_buf[0xf] == '\0') &&
     ((((this->super_cmFindCommon).SearchAppBundleFirst & 1U) != 0 ||
      (((this->super_cmFindCommon).SearchAppBundleOnly & 1U) != 0)))) {
    init.field_2._M_local_buf[0xf] = FindAppBundleConfig(this);
  }
  if (((init.field_2._M_local_buf[0xf] == '\0') &&
      (((this->super_cmFindCommon).SearchFrameworkOnly & 1U) == 0)) &&
     (((this->super_cmFindCommon).SearchAppBundleOnly & 1U) == 0)) {
    init.field_2._M_local_buf[0xf] = FindPrefixedConfig(this);
  }
  if ((init.field_2._M_local_buf[0xf] == '\0') &&
     (((this->super_cmFindCommon).SearchFrameworkLast & 1U) != 0)) {
    init.field_2._M_local_buf[0xf] = FindFrameworkConfig(this);
  }
  if ((init.field_2._M_local_buf[0xf] == '\0') &&
     (((this->super_cmFindCommon).SearchAppBundleLast & 1U) != 0)) {
    init.field_2._M_local_buf[0xf] = FindAppBundleConfig(this);
  }
  std::__cxx11::string::string(local_38);
  if ((init.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&help.field_2 + 8),&this->Variable,"-NOTFOUND");
    std::__cxx11::string::operator=(local_38,(string *)(help.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(help.field_2._M_local_buf + 8));
  }
  else {
    cmsys::SystemTools::GetFilenamePath(&local_58,&this->FileFound);
    std::__cxx11::string::operator=(local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"The directory containing a CMake configuration file for ",&local_a9);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::operator+=(local_a8,(string *)&this->Name);
  std::__cxx11::string::operator+=(local_a8,".");
  this_00 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  value = (char *)std::__cxx11::string::c_str();
  doc = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddCacheDefinition(this_00,&this->Variable,value,doc,PATH,true);
  uVar1 = init.field_2._M_local_buf[0xf];
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_38);
  return (bool)(uVar1 & 1);
}

Assistant:

bool cmFindPackageCommand::FindConfig()
{
  // Compute the set of search prefixes.
  this->ComputePrefixes();

  // Look for the project's configuration file.
  bool found = false;

  // Search for frameworks.
  if (!found && (this->SearchFrameworkFirst || this->SearchFrameworkOnly)) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && (this->SearchAppBundleFirst || this->SearchAppBundleOnly)) {
    found = this->FindAppBundleConfig();
  }

  // Search prefixes.
  if (!found && !(this->SearchFrameworkOnly || this->SearchAppBundleOnly)) {
    found = this->FindPrefixedConfig();
  }

  // Search for frameworks.
  if (!found && this->SearchFrameworkLast) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && this->SearchAppBundleLast) {
    found = this->FindAppBundleConfig();
  }

  // Store the entry in the cache so it can be set by the user.
  std::string init;
  if (found) {
    init = cmSystemTools::GetFilenamePath(this->FileFound);
  } else {
    init = this->Variable + "-NOTFOUND";
  }
  std::string help =
    "The directory containing a CMake configuration file for ";
  help += this->Name;
  help += ".";
  // We force the value since we do not get here if it was already set.
  this->Makefile->AddCacheDefinition(this->Variable, init.c_str(),
                                     help.c_str(), cmStateEnums::PATH, true);
  return found;
}